

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ListColumnData::FetchRow
          (ListColumnData *this,TransactionData transaction,ColumnFetchState *state,row_t row_id,
          Vector *result,idx_t result_idx)

{
  unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true> *this_00;
  data_ptr_t pdVar1;
  Vector *vector;
  ListColumnData *pLVar2;
  bool bVar3;
  uint64_t uVar4;
  reference this_01;
  type state_00;
  idx_t iVar5;
  LogicalType *other;
  pointer this_02;
  pointer pCVar6;
  type pCVar7;
  long lVar8;
  templated_unique_single_t child_state;
  unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>_> local_d0;
  uint64_t local_c8;
  Vector *local_c0;
  ListColumnData *local_b8;
  LogicalType local_b0;
  Vector local_98;
  
  local_c0 = result;
  if ((state->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (state->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    make_uniq<duckdb::ColumnFetchState>();
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>>
                *)&state->child_states,
               (unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
                *)&local_98);
    ::std::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>::
    ~unique_ptr((unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>
                 *)&local_98);
  }
  if ((this->super_ColumnData).start == row_id) {
    local_c8 = 0;
  }
  else {
    local_c8 = FetchListOffset(this,row_id - 1);
  }
  uVar4 = FetchListOffset(this,row_id);
  local_b8 = this;
  this_01 = vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
            ::get<true>(&state->child_states,0);
  state_00 = unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
             ::operator*(this_01);
  vector = local_c0;
  ColumnData::FetchRow
            (&(this->validity).super_ColumnData,transaction,state_00,row_id,local_c0,result_idx);
  FlatVector::VerifyFlatVector(vector);
  pdVar1 = vector->data;
  lVar8 = result_idx * 0x10;
  iVar5 = ListVector::GetListSize(vector);
  *(idx_t *)(pdVar1 + lVar8) = iVar5;
  *(uint64_t *)(pdVar1 + lVar8 + 8) = uVar4 - local_c8;
  bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,result_idx);
  if ((bVar3) && (iVar5 = *(idx_t *)(pdVar1 + lVar8 + 8), iVar5 != 0)) {
    make_uniq<duckdb::ColumnScanState>();
    other = ListType::GetChildType(&local_c0->type);
    LogicalType::LogicalType(&local_b0,other);
    pLVar2 = local_b8;
    uVar4 = local_c8;
    Vector::Vector(&local_98,&local_b0,iVar5);
    LogicalType::~LogicalType(&local_b0);
    this_02 = unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>
              ::operator->((unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>
                            *)&local_d0);
    ColumnScanState::Initialize(this_02,other,(optional_ptr<duckdb::TableScanOptions,_true>)0x0);
    this_00 = &pLVar2->child_column;
    pCVar6 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->(this_00);
    pCVar7 = unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>
             ::operator*((unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>
                          *)&local_d0);
    (*pCVar6->_vptr_ColumnData[8])(pCVar6,pCVar7,uVar4 + (pLVar2->super_ColumnData).start);
    pCVar6 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->(this_00);
    pCVar7 = unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>
             ::operator*((unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>
                          *)&local_d0);
    (*pCVar6->_vptr_ColumnData[0xc])(pCVar6,pCVar7,&local_98,iVar5,0);
    ListVector::Append(local_c0,&local_98,iVar5,0);
    Vector::~Vector(&local_98);
    ::std::unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>_>::
    ~unique_ptr(&local_d0);
  }
  return;
}

Assistant:

void ListColumnData::FetchRow(TransactionData transaction, ColumnFetchState &state, row_t row_id, Vector &result,
                              idx_t result_idx) {
	// insert any child states that are required
	// we need two (validity & list child)
	// note that we need a scan state for the child vector
	// this is because we will (potentially) fetch more than one tuple from the list child
	if (state.child_states.empty()) {
		auto child_state = make_uniq<ColumnFetchState>();
		state.child_states.push_back(std::move(child_state));
	}

	// now perform the fetch within the segment
	auto start_offset = idx_t(row_id) == this->start ? 0 : FetchListOffset(UnsafeNumericCast<idx_t>(row_id - 1));
	auto end_offset = FetchListOffset(UnsafeNumericCast<idx_t>(row_id));
	validity.FetchRow(transaction, *state.child_states[0], row_id, result, result_idx);

	auto &validity = FlatVector::Validity(result);
	auto list_data = FlatVector::GetData<list_entry_t>(result);
	auto &list_entry = list_data[result_idx];
	// set the list entry offset to the size of the current list
	list_entry.offset = ListVector::GetListSize(result);
	list_entry.length = end_offset - start_offset;
	if (!validity.RowIsValid(result_idx)) {
		// the list is NULL! no need to fetch the child
		D_ASSERT(list_entry.length == 0);
		return;
	}

	// now we need to read from the child all the elements between [offset...length]
	auto child_scan_count = list_entry.length;
	if (child_scan_count > 0) {
		auto child_state = make_uniq<ColumnScanState>();
		auto &child_type = ListType::GetChildType(result.GetType());
		Vector child_scan(child_type, child_scan_count);
		// seek the scan towards the specified position and read [length] entries
		child_state->Initialize(child_type, nullptr);
		child_column->InitializeScanWithOffset(*child_state, start + start_offset);
		D_ASSERT(child_type.InternalType() == PhysicalType::STRUCT ||
		         child_state->row_index + child_scan_count - this->start <= child_column->GetMaxEntry());
		child_column->ScanCount(*child_state, child_scan, child_scan_count);

		ListVector::Append(result, child_scan, child_scan_count);
	}
}